

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_compare.cpp
# Opt level: O0

int __thiscall
ON_String::CompareOrdinal(ON_String *this,ON_String *other_string,bool bOrdinalIgnoreCase)

{
  int iVar1;
  int element_count2;
  char *string1;
  char *string2;
  bool bOrdinalIgnoreCase_local;
  ON_String *other_string_local;
  ON_String *this_local;
  
  string1 = operator_cast_to_char_(this);
  iVar1 = Length(this);
  string2 = operator_cast_to_char_(other_string);
  element_count2 = Length(other_string);
  iVar1 = CompareOrdinal(string1,iVar1,string2,element_count2,bOrdinalIgnoreCase);
  return iVar1;
}

Assistant:

int ON_String::CompareOrdinal(
  const ON_String& other_string,
  bool bOrdinalIgnoreCase
  ) const
{
  return ON_String::CompareOrdinal(
    static_cast< const char* >(*this),
    this->Length(),
    static_cast< const char* >(other_string),
    other_string.Length(),
    bOrdinalIgnoreCase
    );
}